

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O2

TagDeclarationCategory __thiscall psy::C::TagDeclarationSymbol::category(TagDeclarationSymbol *this)

{
  SymbolKind SVar1;
  TagDeclarationCategory TVar2;
  ostream *poVar3;
  
  SVar1 = Symbol::kind((Symbol *)this);
  if ((byte)(SVar1 - StructDeclaration) < 3) {
    TVar2 = (TagDeclarationCategory)(0x10000 >> ((SVar1 - StructDeclaration & 3) << 3));
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x43);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar3);
    TVar2 = ~StructOrUnion;
  }
  return TVar2;
}

Assistant:

TagDeclarationCategory TagDeclarationSymbol::category() const
{
    switch (kind()) {
        case SymbolKind::Program:
        case SymbolKind::TranslationUnit:
        case SymbolKind::FunctionDeclaration:
        case SymbolKind::EnumeratorDeclaration:
        case SymbolKind::FieldDeclaration:
        case SymbolKind::VariableDeclaration:
        case SymbolKind::ParameterDeclaration:
        case SymbolKind::TypedefDeclaration:
            break;
        case SymbolKind::StructDeclaration:
        case SymbolKind::UnionDeclaration:
            return TagDeclarationCategory::StructOrUnion;
        case SymbolKind::EnumDeclaration:
            return TagDeclarationCategory::Enum;
    }
    PSY_ASSERT_1(false);
    return TagDeclarationCategory(~0);
}